

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  ImVector<ImGuiOldColumnData> *this;
  float fVar1;
  ImGuiWindow *window;
  ImGuiOldColumnData *pIVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  ImGuiID id;
  ImGuiOldColumns *pIVar8;
  int iVar9;
  ImGuiContext *g;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 local_68;
  ImGuiOldColumnData local_4c;
  
  pIVar7 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  id = GetColumnsID(str_id,columns_count);
  pIVar8 = FindOrCreateColumns(window,id);
  pIVar8->Current = 0;
  pIVar8->Count = columns_count;
  pIVar8->Flags = flags;
  (window->DC).CurrentColumns = pIVar8;
  pIVar8->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar8->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar6 = (window->ClipRect).Max;
  (pIVar8->HostInitialClipRect).Min = (window->ClipRect).Min;
  (pIVar8->HostInitialClipRect).Max = IVar6;
  IVar6 = (window->ParentWorkRect).Max;
  (pIVar8->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
  (pIVar8->HostBackupParentWorkRect).Max = IVar6;
  IVar6 = (window->WorkRect).Max;
  (window->ParentWorkRect).Min = (window->WorkRect).Min;
  (window->ParentWorkRect).Max = IVar6;
  fVar13 = (window->WindowPadding).x;
  fVar1 = (pIVar7->Style).ItemSpacing.x;
  fVar14 = fVar13 * 0.5;
  uVar4 = vcmpss_avx512f(ZEXT416((uint)window->WindowBorderSize),ZEXT416((uint)fVar14),2);
  bVar5 = (bool)((byte)uVar4 & 1);
  fVar12 = (window->WorkRect).Max.x;
  fVar13 = fVar1 - fVar13;
  uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar13),2);
  auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(float)((uint)bVar5 * (int)fVar14 +
                                                   (uint)!bVar5 * (int)window->WindowBorderSize)));
  fVar13 = (float)((uint)((byte)uVar4 & 1) * (int)fVar13);
  auVar3 = vminss_avx(ZEXT416((uint)((fVar1 + fVar12) - fVar13)),
                      ZEXT416((uint)(fVar12 + auVar3._0_4_)));
  fVar13 = fVar13 + ((window->DC).Indent.x - fVar1);
  pIVar8->OffMinX = fVar13;
  fVar13 = fVar13 + 1.0;
  fVar12 = auVar3._0_4_ - (window->Pos).x;
  uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)fVar12),2);
  bVar5 = (bool)((byte)uVar4 & 1);
  pIVar8->OffMaxX = (float)((uint)bVar5 * (int)fVar12 + (uint)!bVar5 * (int)fVar13);
  fVar13 = (window->DC).CursorPos.y;
  this = &pIVar8->Columns;
  pIVar8->LineMaxY = fVar13;
  pIVar8->LineMinY = fVar13;
  iVar9 = (pIVar8->Columns).Size;
  if (iVar9 != columns_count + 1 && iVar9 != 0) {
    ImVector<ImGuiOldColumnData>::resize(this,0);
    iVar9 = this->Size;
  }
  pIVar8->IsFirstFrame = iVar9 == 0;
  if (iVar9 == 0) {
    ImVector<ImGuiOldColumnData>::reserve(this,columns_count + 1);
    for (iVar9 = 0; iVar9 <= columns_count; iVar9 = iVar9 + 1) {
      local_4c.ClipRect.Max.x = 0.0;
      local_4c.ClipRect.Max.y = 0.0;
      local_4c.OffsetNormBeforeResize = 0.0;
      local_4c.Flags = 0;
      local_4c.ClipRect.Min.x = 0.0;
      local_4c.ClipRect.Min.y = 0.0;
      local_4c.OffsetNorm = (float)iVar9 / (float)columns_count;
      ImVector<ImGuiOldColumnData>::push_back(this,&local_4c);
    }
  }
  lVar10 = 0xc;
  uVar11 = 0;
  while ((uint)(~(columns_count >> 0x1f) & columns_count) != uVar11) {
    pIVar2 = (pIVar8->Columns).Data;
    fVar13 = (window->Pos).x;
    fVar12 = GetColumnOffset((int)uVar11);
    uVar11 = uVar11 + 1;
    auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar12 + fVar13 + 0.5)));
    fVar12 = GetColumnOffset((int)uVar11);
    local_68 = auVar3._0_4_;
    *(undefined4 *)((long)&pIVar2->OffsetNorm + lVar10) = local_68;
    *(undefined4 *)((long)&pIVar2->OffsetNormBeforeResize + lVar10) = 0xff7fffff;
    auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar12 + fVar13 + -1.0 + 0.5)));
    *(int *)((long)&pIVar2->Flags + lVar10) = auVar3._0_4_;
    *(undefined4 *)((long)&(pIVar2->ClipRect).Min.x + lVar10) = 0x7f7fffff;
    ImRect::ClipWithFull((ImRect *)((long)&pIVar2->OffsetNorm + lVar10),&window->ClipRect);
    lVar10 = lVar10 + 0x1c;
  }
  if (1 < pIVar8->Count) {
    ImDrawListSplitter::Split(&pIVar8->Splitter,window->DrawList,pIVar8->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar8->Splitter,window->DrawList,1);
    PushColumnClipRect(0);
  }
  iVar9 = pIVar8->Current;
  fVar13 = GetColumnOffset(iVar9);
  fVar14 = GetColumnOffset(iVar9 + 1);
  PushItemWidth((fVar14 - fVar13) * 0.65);
  fVar12 = fVar1 - (window->WindowPadding).x;
  uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar12),2);
  fVar12 = (float)((uint)((byte)uVar4 & 1) * (int)fVar12);
  (window->DC).ColumnsOffset.x = fVar12;
  fVar13 = (window->Pos).x;
  auVar3 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar12 + fVar13 + (window->DC).Indent.x)));
  (window->DC).CursorPos.x = auVar3._0_4_;
  (window->WorkRect).Max.x = (fVar13 + fVar14) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}